

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isGateType(TokenKind kind)

{
  TokenKind kind_local;
  bool local_1;
  
  switch(kind) {
  case AndKeyword:
  case BufKeyword:
  case BufIf0Keyword:
  case BufIf1Keyword:
  case CmosKeyword:
  case NandKeyword:
  case NmosKeyword:
  case NorKeyword:
  case NotKeyword:
  case NotIf0Keyword:
  case NotIf1Keyword:
  case OrKeyword:
  case PmosKeyword:
  case PullDownKeyword:
  case PullUpKeyword:
  case RcmosKeyword:
  case RnmosKeyword:
  case RpmosKeyword:
  case RtranKeyword:
  case RtranIf0Keyword:
  case RtranIf1Keyword:
  case TranKeyword:
  case TranIf0Keyword:
  case TranIf1Keyword:
  case XnorKeyword:
  case XorKeyword:
    local_1 = true;
    break;
  default:
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SyntaxFacts::isGateType(TokenKind kind) {
    switch (kind) {
        case TokenKind::CmosKeyword:
        case TokenKind::RcmosKeyword:
        case TokenKind::NmosKeyword:
        case TokenKind::PmosKeyword:
        case TokenKind::RnmosKeyword:
        case TokenKind::RpmosKeyword:
        case TokenKind::BufIf0Keyword:
        case TokenKind::BufIf1Keyword:
        case TokenKind::NotIf0Keyword:
        case TokenKind::NotIf1Keyword:
        case TokenKind::AndKeyword:
        case TokenKind::NandKeyword:
        case TokenKind::OrKeyword:
        case TokenKind::NorKeyword:
        case TokenKind::XorKeyword:
        case TokenKind::XnorKeyword:
        case TokenKind::BufKeyword:
        case TokenKind::NotKeyword:
        case TokenKind::TranIf0Keyword:
        case TokenKind::TranIf1Keyword:
        case TokenKind::RtranIf0Keyword:
        case TokenKind::RtranIf1Keyword:
        case TokenKind::TranKeyword:
        case TokenKind::RtranKeyword:
        case TokenKind::PullDownKeyword:
        case TokenKind::PullUpKeyword:
            return true;
        default:
            return false;
    }
}